

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int ARKodeSetMassEpsLin(void *arkode_mem,sunrealtype eplifac)

{
  long lVar1;
  int line;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar2 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    line = 0x657;
  }
  else {
    if (*(int *)((long)arkode_mem + 0x200) != 0) {
      lVar1 = (**(code **)((long)arkode_mem + 0x218))(arkode_mem);
      if (lVar1 != 0) {
        *(ulong *)(lVar1 + 0x28) =
             ~-(ulong)(eplifac <= 0.0) & (ulong)eplifac |
             -(ulong)(eplifac <= 0.0) & 0x3fa999999999999a;
        return 0;
      }
      arkProcessError((ARKodeMem)arkode_mem,-6,0x101d,"ARKodeSetMassEpsLin",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                      ,"Mass matrix solver memory is NULL.");
      return -6;
    }
    msgfmt = "time-stepping module does not support non-identity mass matrices";
    iVar2 = -0x30;
    error_code = -0x30;
    line = 0x660;
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,line,"ARKodeSetMassEpsLin",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                  ,msgfmt);
  return iVar2;
}

Assistant:

int ARKodeSetMassEpsLin(void* arkode_mem, sunrealtype eplifac)
{
  ARKodeMem ark_mem;
  ARKLsMassMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not support mass matrices */
  if (!ark_mem->step_supports_massmatrix)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support non-identity mass matrices");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* store input and return */
  arkls_mem->eplifac = (eplifac <= ZERO) ? ARKLS_EPLIN : eplifac;

  return (ARKLS_SUCCESS);
}